

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyword.cpp
# Opt level: O0

void __thiscall ninx::lexer::token::Keyword::Keyword(Keyword *this,int line_number,string *keyword)

{
  size_type sVar1;
  mapped_type *pmVar2;
  string *keyword_local;
  int line_number_local;
  Keyword *this_local;
  
  Token::Token(&this->super_Token,line_number);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Keyword_002887d0;
  std::__cxx11::string::string((string *)&this->keyword,(string *)keyword);
  this->late = false;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
                   *)RESERVED_KEYWORDS_abi_cxx11_,keyword);
  if (sVar1 == 0) {
    this->type = FUNCNAME;
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
                   *)RESERVED_KEYWORDS_abi_cxx11_,keyword);
    this->type = *pmVar2;
  }
  return;
}

Assistant:

ninx::lexer::token::Keyword::Keyword(int line_number, const std::string &keyword) : Token(line_number), keyword(keyword) {
    if (RESERVED_KEYWORDS.count(keyword) > 0) {  // The given keyword is a reserved one, get the corresponding Type
        this->type = RESERVED_KEYWORDS.at(keyword);
    }else{
        this->type = Type::FUNCNAME;  // If a keyword is not reserved, then it is a function call
    }
}